

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditTextureFormatTests.cpp
# Opt level: O2

IterateResult __thiscall
dit::anon_unknown_0::DepthStencilFormatCase::iterate(DepthStencilFormatCase *this)

{
  ostringstream *poVar1;
  int iVar2;
  int ndx;
  PixelBufferAccess tmpAccess;
  ConstPixelBufferAccess inputAccess;
  PixelBufferAccess tmpStencilAccess;
  PixelBufferAccess tmpDepthAccess;
  ConstPixelBufferAccess inputStencilAccess;
  ConstPixelBufferAccess inputDepthAccess;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmpMem;
  MessageBuilder local_1a0;
  
  getInputAccess(tmpAccess.super_ConstPixelBufferAccess.m_format);
  iVar2 = tcu::getPixelSize(inputAccess.m_format);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&tmpMem,(long)(iVar2 * inputAccess.m_size.m_data[0]),(allocator_type *)&local_1a0);
  tcu::PixelBufferAccess::PixelBufferAccess
            (&tmpAccess,&inputAccess.m_format,inputAccess.m_size.m_data[0],1,1,
             tmpMem.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  tcu::getEffectiveDepthStencilAccess(&inputDepthAccess,&inputAccess,MODE_DEPTH);
  tcu::getEffectiveDepthStencilAccess(&inputStencilAccess,&inputAccess,MODE_STENCIL);
  tcu::getEffectiveDepthStencilAccess(&tmpDepthAccess,&tmpAccess,MODE_DEPTH);
  tcu::getEffectiveDepthStencilAccess(&tmpStencilAccess,&tmpAccess,MODE_STENCIL);
  tcu::TestContext::setTestResult
            ((this->super_TextureFormatCase).super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_PASS,"Pass");
  TextureFormatCase::verifyInfoQueries(&this->super_TextureFormatCase);
  TextureFormatCase::verifyRead(&this->super_TextureFormatCase,&inputDepthAccess);
  TextureFormatCase::verifyRead(&this->super_TextureFormatCase,&inputStencilAccess);
  TextureFormatCase::verifyGetPixDepth
            (&this->super_TextureFormatCase,&inputDepthAccess,&inputAccess);
  TextureFormatCase::verifyGetPixStencil
            (&this->super_TextureFormatCase,&inputStencilAccess,&inputAccess);
  local_1a0.m_log = ((this->super_TextureFormatCase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  poVar1 = &local_1a0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Copying both depth and stencil with getPixel() -> setPixel()");
  tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  copyPixels(&inputDepthAccess,&tmpDepthAccess);
  copyPixels(&inputStencilAccess,&tmpStencilAccess);
  TextureFormatCase::verifyRead
            (&this->super_TextureFormatCase,&tmpDepthAccess.super_ConstPixelBufferAccess);
  TextureFormatCase::verifyRead
            (&this->super_TextureFormatCase,&tmpStencilAccess.super_ConstPixelBufferAccess);
  local_1a0.m_log = ((this->super_TextureFormatCase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  poVar1 = &local_1a0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,
                  "Copying both depth and stencil with getPix{Depth,Stencil}() -> setPix{Depth,Stencil}()"
                 );
  tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  copyGetSetDepth(&inputDepthAccess,&tmpDepthAccess);
  copyGetSetStencil(&inputStencilAccess,&tmpStencilAccess);
  TextureFormatCase::verifyRead
            (&this->super_TextureFormatCase,&tmpDepthAccess.super_ConstPixelBufferAccess);
  TextureFormatCase::verifyRead
            (&this->super_TextureFormatCase,&tmpStencilAccess.super_ConstPixelBufferAccess);
  local_1a0.m_log = ((this->super_TextureFormatCase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  poVar1 = &local_1a0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,
                  "Verifying that clearing depth component with clearDepth() doesn\'t affect stencil"
                 );
  tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  tcu::copy((EVP_PKEY_CTX *)&tmpAccess,(EVP_PKEY_CTX *)&inputAccess);
  tcu::clearDepth(&tmpAccess,0.0);
  TextureFormatCase::verifyRead
            (&this->super_TextureFormatCase,&tmpStencilAccess.super_ConstPixelBufferAccess);
  local_1a0.m_log = ((this->super_TextureFormatCase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  poVar1 = &local_1a0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,
                  "Verifying that clearing stencil component with clearStencil() doesn\'t affect depth"
                 );
  tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  tcu::copy((EVP_PKEY_CTX *)&tmpAccess,(EVP_PKEY_CTX *)&inputAccess);
  tcu::clearStencil(&tmpAccess,0);
  TextureFormatCase::verifyRead
            (&this->super_TextureFormatCase,&tmpDepthAccess.super_ConstPixelBufferAccess);
  local_1a0.m_log = ((this->super_TextureFormatCase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  poVar1 = &local_1a0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,
                  "Verifying that clearing depth component with setPixDepth() doesn\'t affect stencil"
                 );
  tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  tcu::copy((EVP_PKEY_CTX *)&tmpAccess,(EVP_PKEY_CTX *)&inputAccess);
  for (iVar2 = 0; iVar2 < tmpAccess.super_ConstPixelBufferAccess.m_size.m_data[0]; iVar2 = iVar2 + 1
      ) {
    tcu::PixelBufferAccess::setPixDepth(&tmpAccess,0.0,iVar2,0,0);
  }
  TextureFormatCase::verifyRead
            (&this->super_TextureFormatCase,&tmpStencilAccess.super_ConstPixelBufferAccess);
  local_1a0.m_log = ((this->super_TextureFormatCase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  poVar1 = &local_1a0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,
                  "Verifying that clearing stencil component with setPixStencil() doesn\'t affect depth"
                 );
  tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  tcu::copy((EVP_PKEY_CTX *)&tmpAccess,(EVP_PKEY_CTX *)&inputAccess);
  for (iVar2 = 0; iVar2 < tmpAccess.super_ConstPixelBufferAccess.m_size.m_data[0]; iVar2 = iVar2 + 1
      ) {
    tcu::PixelBufferAccess::setPixStencil(&tmpAccess,0,iVar2,0,0);
  }
  TextureFormatCase::verifyRead
            (&this->super_TextureFormatCase,&tmpDepthAccess.super_ConstPixelBufferAccess);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&tmpMem.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const ConstPixelBufferAccess	inputAccess			= getInputAccess(m_format);
		vector<deUint8>					tmpMem				(getPixelSize(inputAccess.getFormat())*inputAccess.getWidth());
		const PixelBufferAccess			tmpAccess			(inputAccess.getFormat(), inputAccess.getWidth(), 1, 1, &tmpMem[0]);
		const ConstPixelBufferAccess	inputDepthAccess	= getEffectiveDepthStencilAccess(inputAccess, tcu::Sampler::MODE_DEPTH);
		const ConstPixelBufferAccess	inputStencilAccess	= getEffectiveDepthStencilAccess(inputAccess, tcu::Sampler::MODE_STENCIL);
		const PixelBufferAccess			tmpDepthAccess		= getEffectiveDepthStencilAccess(tmpAccess, tcu::Sampler::MODE_DEPTH);
		const PixelBufferAccess			tmpStencilAccess	= getEffectiveDepthStencilAccess(tmpAccess, tcu::Sampler::MODE_STENCIL);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		verifyInfoQueries();

		verifyRead(inputDepthAccess);
		verifyRead(inputStencilAccess);

		verifyGetPixDepth(inputDepthAccess, inputAccess);
		verifyGetPixStencil(inputStencilAccess, inputAccess);

		m_testCtx.getLog() << TestLog::Message << "Copying both depth and stencil with getPixel() -> setPixel()" << TestLog::EndMessage;
		copyPixels(inputDepthAccess, tmpDepthAccess);
		copyPixels(inputStencilAccess, tmpStencilAccess);
		verifyRead(tmpDepthAccess);
		verifyRead(tmpStencilAccess);

		m_testCtx.getLog() << TestLog::Message << "Copying both depth and stencil with getPix{Depth,Stencil}() -> setPix{Depth,Stencil}()" << TestLog::EndMessage;
		copyGetSetDepth(inputDepthAccess, tmpDepthAccess);
		copyGetSetStencil(inputStencilAccess, tmpStencilAccess);
		verifyRead(tmpDepthAccess);
		verifyRead(tmpStencilAccess);

		m_testCtx.getLog() << TestLog::Message << "Verifying that clearing depth component with clearDepth() doesn't affect stencil" << TestLog::EndMessage;
		tcu::copy(tmpAccess, inputAccess);
		tcu::clearDepth(tmpAccess, 0.0f);
		verifyRead(tmpStencilAccess);

		m_testCtx.getLog() << TestLog::Message << "Verifying that clearing stencil component with clearStencil() doesn't affect depth" << TestLog::EndMessage;
		tcu::copy(tmpAccess, inputAccess);
		tcu::clearStencil(tmpAccess, 0);
		verifyRead(tmpDepthAccess);

		m_testCtx.getLog() << TestLog::Message << "Verifying that clearing depth component with setPixDepth() doesn't affect stencil" << TestLog::EndMessage;
		tcu::copy(tmpAccess, inputAccess);

		for (int ndx = 0; ndx < tmpAccess.getWidth(); ndx++)
			tmpAccess.setPixDepth(0.0f, ndx, 0, 0);

		verifyRead(tmpStencilAccess);

		m_testCtx.getLog() << TestLog::Message << "Verifying that clearing stencil component with setPixStencil() doesn't affect depth" << TestLog::EndMessage;
		tcu::copy(tmpAccess, inputAccess);

		for (int ndx = 0; ndx < tmpAccess.getWidth(); ndx++)
			tmpAccess.setPixStencil(0, ndx, 0, 0);

		verifyRead(tmpDepthAccess);

		return STOP;
	}